

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_register_allocation.cpp
# Opt level: O3

void mocker::anon_unknown_1::allocate
               (shared_ptr<mocker::nasm::Inst> *inst,RegMap<std::size_t> *offsets,Section *text)

{
  size_t *psVar1;
  int iVar2;
  shared_ptr<mocker::nasm::Register> *psVar3;
  _Node *p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  bool bVar5;
  shared_ptr<mocker::nasm::Register> pReg;
  shared_ptr<mocker::nasm::Addr> dest;
  shared_ptr<mocker::nasm::Register> vReg;
  shared_ptr<mocker::nasm::Addr> operand;
  shared_ptr<mocker::nasm::LabelAddr> labelAddr;
  shared_ptr<mocker::nasm::MemoryAddr> memAddr;
  shared_ptr<mocker::nasm::Register> reg1;
  shared_ptr<mocker::nasm::Mov> p;
  shared_ptr<mocker::nasm::Addr> local_118;
  shared_ptr<mocker::nasm::Addr> local_108;
  shared_ptr<mocker::nasm::Addr> local_f8;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_e8;
  shared_ptr<mocker::nasm::LabelAddr> local_d0;
  shared_ptr<mocker::nasm::Addr> local_c0;
  undefined1 local_a9;
  shared_ptr<mocker::nasm::MemoryAddr> local_a8;
  shared_ptr<mocker::nasm::Register> local_98;
  shared_ptr<mocker::nasm::Addr> local_88;
  shared_ptr<mocker::nasm::Inst> local_78;
  shared_ptr<mocker::nasm::Inst> local_68;
  shared_ptr<mocker::nasm::Inst> local_58;
  long local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  shared_ptr<mocker::nasm::Inst> local_38;
  
  nasm::getInvolvedRegs(&local_e8,inst);
  if (local_e8.
      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_e8.
      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::~vector(&local_e8);
  }
  else {
    nasm::dyc<mocker::nasm::Call,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_108,inst)
    ;
    bVar5 = true;
    if ((element_type *)
        local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      nasm::dyc<mocker::nasm::Leave,std::shared_ptr<mocker::nasm::Inst>const&>
                ((nasm *)&local_118,inst);
      bVar5 = true;
      if ((element_type *)
          local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        nasm::dyc<mocker::nasm::Ret,std::shared_ptr<mocker::nasm::Inst>const&>
                  ((nasm *)&local_f8,inst);
        bVar5 = true;
        if ((element_type *)
            local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          nasm::dyc<mocker::nasm::Cqo,std::shared_ptr<mocker::nasm::Inst>const&>
                    ((nasm *)&local_d0,inst);
          bVar5 = local_d0.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0;
          if (local_d0.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.
                       super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        if (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    if (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::~vector(&local_e8);
    if (!bVar5) {
      nasm::dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_48,inst)
      ;
      if (local_48 != 0) {
        local_e8.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(local_48 + 0x18);
        local_e8.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(local_48 + 0x20);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_e8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_e8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_e8.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_e8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_e8.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
          }
        }
        nasm::dyc<mocker::nasm::NumericConstant,std::shared_ptr<mocker::nasm::Addr>&>
                  ((nasm *)&local_108,(shared_ptr<mocker::nasm::Addr> *)&local_e8);
        if ((element_type *)
            local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          dycPReg((anon_unknown_1 *)&local_118,(shared_ptr<mocker::nasm::Addr> *)&local_e8);
          if ((element_type *)
              local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            dycVReg((anon_unknown_1 *)&local_f8,(shared_ptr<mocker::nasm::Addr> *)&local_e8);
            if ((element_type *)
                local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                == (element_type *)0x0) {
              nasm::dyc<mocker::nasm::LabelAddr,std::shared_ptr<mocker::nasm::Addr>&>
                        ((nasm *)&local_d0,(shared_ptr<mocker::nasm::Addr> *)&local_e8);
              if (local_d0.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr == (element_type *)0x0) {
                nasm::dyc<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Addr>&>
                          ((nasm *)&local_c0,(shared_ptr<mocker::nasm::Addr> *)&local_e8);
                if (local_c0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr == (element_type *)0x0) {
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                                ,99,
                                "void mocker::(anonymous namespace)::allocateMov(const std::shared_ptr<nasm::Mov> &, const RegMap<std::size_t> &, nasm::Section &)"
                               );
                }
                if (local_c0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr[3]._vptr_Addr != (_func_int **)0x0) {
                  __assert_fail("!memAddr->getReg2()",
                                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                                ,0x5a,
                                "void mocker::(anonymous namespace)::allocateMov(const std::shared_ptr<nasm::Mov> &, const RegMap<std::size_t> &, nasm::Section &)"
                               );
                }
                local_98.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)
                         local_c0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr[1]._vptr_Addr;
                local_98.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr[2]._vptr_Addr;
                if (local_98.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                }
                else {
                  local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       local_98.
                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_98.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (local_98.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                    if (local_98.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded != '\0') goto LAB_001276b5;
                      LOCK();
                      (local_98.
                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_98.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                  }
                  else {
                    (local_98.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (local_98.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
LAB_001276b5:
                    (local_98.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (local_98.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)
                     local_98.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
                dycVReg((anon_unknown_1 *)&local_a8,&local_88);
                if (local_a8.
                    super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_a8.
                             super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                if (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_88.
                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (local_a8.
                    super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    != (element_type *)0x0) {
                  if ((nasm::r11()::res == '\0') &&
                     (iVar2 = __cxa_guard_acquire(&nasm::r11()::res), iVar2 != 0)) {
                    nasm::r11::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                              (&nasm::r11::res.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,(Register **)&nasm::r11::res,
                               (allocator<mocker::nasm::Register> *)&local_a8,(char (*) [4])"r11");
                    __cxa_atexit(std::
                                 __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                                 ~__shared_ptr,&nasm::r11::res,&__dso_handle);
                    __cxa_guard_release(&nasm::r11()::res);
                  }
                  loadVReg(&nasm::r11::res,&local_98,offsets,text);
                  if ((nasm::r11()::res == '\0') &&
                     (iVar2 = __cxa_guard_acquire(&nasm::r11()::res), iVar2 != 0)) {
                    nasm::r11::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                              (&nasm::r11::res.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,(Register **)&nasm::r11::res,
                               (allocator<mocker::nasm::Register> *)&local_a8,(char (*) [4])"r11");
                    __cxa_atexit(std::
                                 __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                                 ~__shared_ptr,&nasm::r11::res,&__dso_handle);
                    __cxa_guard_release(&nasm::r11()::res);
                  }
                  local_98.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = nasm::r11::res.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                            (&local_98.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,
                             &nasm::r11::res.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                }
                if ((nasm::r10()::res == '\0') &&
                   (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
                  nasm::r10::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x0;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                  __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                            (&nasm::r10::res.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,(Register **)&nasm::r10::res,
                             (allocator<mocker::nasm::Register> *)&local_a8,(char (*) [4])"r10");
                  __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ::~__shared_ptr,&nasm::r10::res,&__dso_handle);
                  __cxa_guard_release(&nasm::r10()::res);
                }
                local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)
                     CONCAT44(local_88.
                              super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._4_4_,
                              *(undefined4 *)
                               &local_c0.
                                super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr[6]._vptr_Addr);
                local_a8.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::nasm::MemoryAddr,std::allocator<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Register>&,int>
                          (&local_a8.
                            super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,(MemoryAddr **)&local_a8,
                           (allocator<mocker::nasm::MemoryAddr> *)&local_a9,&local_98,
                           (int *)&local_88);
                nasm::Section::
                emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::MemoryAddr>>
                          (text,&nasm::r10::res,&local_a8);
                if (local_a8.
                    super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_a8.
                             super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                if (local_98.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_98.
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (local_c0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_c0.
                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
              }
              else {
                if ((nasm::r10()::res == '\0') &&
                   (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
                  nasm::r10::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x0;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                  __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                            (&nasm::r10::res.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,(Register **)&nasm::r10::res,
                             (allocator<mocker::nasm::Register> *)&local_c0,(char (*) [4])"r10");
                  __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ::~__shared_ptr,&nasm::r10::res,&__dso_handle);
                  __cxa_guard_release(&nasm::r10()::res);
                }
                nasm::Section::
                emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::LabelAddr>&>
                          (text,&nasm::r10::res,&local_d0);
              }
              if (local_d0.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_d0.
                           super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            else {
              if ((nasm::r10()::res == '\0') &&
                 (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
                nasm::r10::res.
                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                          (&nasm::r10::res.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Register **)&nasm::r10::res,
                           (allocator<mocker::nasm::Register> *)&local_d0,(char (*) [4])"r10");
                __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                             ~__shared_ptr,&nasm::r10::res,&__dso_handle);
                __cxa_guard_release(&nasm::r10()::res);
              }
              loadVReg(&nasm::r10::res,(shared_ptr<mocker::nasm::Register> *)&local_f8,offsets,text)
              ;
            }
            if (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
          }
          else {
            if ((nasm::r10()::res == '\0') &&
               (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
              nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                        (&nasm::r10::res.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(Register **)&nasm::r10::res,
                         (allocator<mocker::nasm::Register> *)&local_f8,(char (*) [4])"r10");
              __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                           ~__shared_ptr,&nasm::r10::res,&__dso_handle);
              __cxa_guard_release(&nasm::r10()::res);
            }
            nasm::Section::
            emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>&>
                      (text,&nasm::r10::res,(shared_ptr<mocker::nasm::Register> *)&local_118);
          }
          if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        else {
          if ((nasm::r10()::res == '\0') &&
             (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
            nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::r10::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::r10::res,
                       (allocator<mocker::nasm::Register> *)&local_118,(char (*) [4])"r10");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::r10::res,&__dso_handle);
            __cxa_guard_release(&nasm::r10()::res);
          }
          nasm::Section::
          emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>&>
                    (text,&nasm::r10::res,(shared_ptr<mocker::nasm::NumericConstant> *)&local_108);
        }
        if (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)(local_48 + 8);
        local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_48 + 0x10);
        if (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        dycPReg((anon_unknown_1 *)&local_118,&local_108);
        if ((element_type *)
            local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          dycVReg((anon_unknown_1 *)&local_118,&local_108);
          if ((element_type *)
              local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_118.
                         super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            nasm::dyc<mocker::nasm::LabelAddr,std::shared_ptr<mocker::nasm::Addr>&>
                      ((nasm *)&local_118,&local_108);
            if ((element_type *)
                local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                != (element_type *)0x0) {
              if ((nasm::r10()::res == '\0') &&
                 (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
                nasm::r10::res.
                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                          (&nasm::r10::res.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Register **)&nasm::r10::res,
                           (allocator<mocker::nasm::Register> *)&local_f8,(char (*) [4])"r10");
                __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                             ~__shared_ptr,&nasm::r10::res,&__dso_handle);
                __cxa_guard_release(&nasm::r10()::res);
              }
              nasm::Section::
              emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::LabelAddr>&,std::shared_ptr<mocker::nasm::Register>const&>
                        (text,(shared_ptr<mocker::nasm::LabelAddr> *)&local_118,&nasm::r10::res);
              goto LAB_00127a63;
            }
            if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_118.
                         super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            nasm::dyc<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Addr>&>
                      ((nasm *)&local_118,&local_108);
            if ((element_type *)
                local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                == (element_type *)0x0) {
              if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_118.
                           super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                            ,0x81,
                            "void mocker::(anonymous namespace)::allocateMov(const std::shared_ptr<nasm::Mov> &, const RegMap<std::size_t> &, nasm::Section &)"
                           );
            }
            if ((((string *)
                 ((long)local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 8))->field_2)._M_allocated_capacity != 0) {
              __assert_fail("!memAddr->getReg2()",
                            "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                            ,0x75,
                            "void mocker::(anonymous namespace)::allocateMov(const std::shared_ptr<nasm::Mov> &, const RegMap<std::size_t> &, nasm::Section &)"
                           );
            }
            local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 (((string *)
                  ((long)local_118.
                         super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                  8))->_M_dataplus)._M_p;
            local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((string *)
                    ((long)local_118.
                           super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    + 8))->_M_string_length;
            if (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              local_c0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            else {
              local_c0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
                if (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded != '\0') goto LAB_00127b20;
                  LOCK();
                  (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
              }
              else {
                (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
LAB_00127b20:
                (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_c0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            dycVReg((anon_unknown_1 *)&local_d0,&local_c0);
            if (local_d0.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_d0.
                         super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_c0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_c0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if (local_d0.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (element_type *)0x0) {
              if ((nasm::r11()::res == '\0') &&
                 (iVar2 = __cxa_guard_acquire(&nasm::r11()::res), iVar2 != 0)) {
                nasm::r11::res.
                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                          (&nasm::r11::res.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Register **)&nasm::r11::res,
                           (allocator<mocker::nasm::Register> *)&local_d0,(char (*) [4])"r11");
                __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                             ~__shared_ptr,&nasm::r11::res,&__dso_handle);
                __cxa_guard_release(&nasm::r11()::res);
              }
              loadVReg(&nasm::r11::res,(shared_ptr<mocker::nasm::Register> *)&local_f8,offsets,text)
              ;
              if ((nasm::r11()::res == '\0') &&
                 (iVar2 = __cxa_guard_acquire(&nasm::r11()::res), iVar2 != 0)) {
                nasm::r11::res.
                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                          (&nasm::r11::res.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Register **)&nasm::r11::res,
                           (allocator<mocker::nasm::Register> *)&local_d0,(char (*) [4])"r11");
                __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                             ~__shared_ptr,&nasm::r11::res,&__dso_handle);
                __cxa_guard_release(&nasm::r11()::res);
              }
              local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   &(nasm::r11::res.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_Addr;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&local_f8.
                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                         &nasm::r11::res.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            if ((nasm::r11()::res == '\0') &&
               (iVar2 = __cxa_guard_acquire(&nasm::r11()::res), iVar2 != 0)) {
              nasm::r11::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                        (&nasm::r11::res.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(Register **)&nasm::r11::res,
                         (allocator<mocker::nasm::Register> *)&local_c0,(char (*) [4])"r11");
              __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                           ~__shared_ptr,&nasm::r11::res,&__dso_handle);
              __cxa_guard_release(&nasm::r11()::res);
            }
            local_c0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 CONCAT44(local_c0.
                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                          _4_4_,*(undefined4 *)
                                 &(((element_type *)
                                   ((long)local_118.
                                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x28))->identifier)._M_dataplus._M_p);
            local_d0.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::MemoryAddr,std::allocator<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Register>const&,int>
                      (&local_d0.
                        super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(MemoryAddr **)&local_d0,
                       (allocator<mocker::nasm::MemoryAddr> *)&local_98,&nasm::r11::res,
                       (int *)&local_c0);
            if ((nasm::r10()::res == '\0') &&
               (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
              nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                        (&nasm::r10::res.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(Register **)&nasm::r10::res,
                         (allocator<mocker::nasm::Register> *)&local_98,(char (*) [4])"r10");
              __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                           ~__shared_ptr,&nasm::r10::res,&__dso_handle);
              __cxa_guard_release(&nasm::r10()::res);
            }
            nasm::Section::
            emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Register>const&>
                      (text,(shared_ptr<mocker::nasm::MemoryAddr> *)&local_d0,&nasm::r10::res);
            if (local_d0.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_d0.
                         super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          else {
            if ((nasm::r10()::res == '\0') &&
               (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
              nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                        (&nasm::r10::res.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(Register **)&nasm::r10::res,
                         (allocator<mocker::nasm::Register> *)&local_d0,(char (*) [4])"r10");
              __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                           ~__shared_ptr,&nasm::r10::res,&__dso_handle);
              __cxa_guard_release(&nasm::r10()::res);
            }
            local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 &(nasm::r10::res.
                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_Addr;
            local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = nasm::r10::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
            if (nasm::r10::res.
                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (nasm::r10::res.
                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_use_count =
                     (nasm::r10::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (nasm::r10::res.
                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_use_count =
                     (nasm::r10::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            storeVReg((shared_ptr<mocker::nasm::Register> *)&local_118,&local_f8,offsets,text);
          }
          if (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        else {
          if ((nasm::r10()::res == '\0') &&
             (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
            nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::r10::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::r10::res,
                       (allocator<mocker::nasm::Register> *)&local_f8,(char (*) [4])"r10");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::r10::res,&__dso_handle);
            __cxa_guard_release(&nasm::r10()::res);
          }
          nasm::Section::
          emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
                    (text,(shared_ptr<mocker::nasm::Register> *)&local_118,&nasm::r10::res);
        }
LAB_00127a63:
        if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_e8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_e8.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        goto LAB_00127a98;
      }
      if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
      }
      nasm::dyc<mocker::nasm::BinaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                ((nasm *)&local_e8,inst);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_e8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_e8.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        nasm::dyc<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Inst>const&>
                  ((nasm *)&local_e8,inst);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_e8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_e8.
              super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_e8.
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          nasm::dyc<mocker::nasm::Pop,std::shared_ptr<mocker::nasm::Inst>const&>
                    ((nasm *)&local_e8,inst);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_e8.
              super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_e8.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_e8.
                         super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            nasm::dyc<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Inst>const&>
                      ((nasm *)&local_e8,inst);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_e8.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_e8.
                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_e8.
                           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
              }
              nasm::dyc<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Inst>const&>
                        ((nasm *)&local_e8,inst);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_e8.
                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_e8.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_e8.
                             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                }
                nasm::dyc<mocker::nasm::Set,std::shared_ptr<mocker::nasm::Inst>const&>
                          ((nasm *)&local_e8,inst);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_e8.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_e8.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_e8.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
                  }
                  nasm::dyc<mocker::nasm::UnaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                            ((nasm *)&local_e8,inst);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_e8.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_start ==
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        local_e8.
                        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_e8.
                                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
                    }
                    nasm::dyc<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Inst>const&>
                              ((nasm *)&local_e8,inst);
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        local_e8.
                        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        ._M_impl.super__Vector_impl_data._M_start ==
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_e8.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   local_e8.
                                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
                      }
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                                    ,0xee,
                                    "void mocker::(anonymous namespace)::allocate(const std::shared_ptr<nasm::Inst> &, const RegMap<std::size_t> &, nasm::Section &)"
                                   );
                    }
                    dycVReg((anon_unknown_1 *)&local_108,
                            (shared_ptr<mocker::nasm::Addr> *)
                            ((long)local_e8.
                                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 8));
                    if ((element_type *)
                        local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr != (element_type *)0x0) {
                      if ((nasm::r10()::res == '\0') &&
                         (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
                        nasm::r10::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr = (element_type *)0x0;
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                                  (&nasm::r10::res.
                                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,(Register **)&nasm::r10::res,
                                   (allocator<mocker::nasm::Register> *)&local_118,
                                   (char (*) [4])"r10");
                        __cxa_atexit(std::
                                     __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                     ::~__shared_ptr,&nasm::r10::res,&__dso_handle);
                        __cxa_guard_release(&nasm::r10()::res);
                      }
                      loadVReg(&nasm::r10::res,(shared_ptr<mocker::nasm::Register> *)&local_108,
                               offsets,text);
                      if ((nasm::r10()::res == '\0') &&
                         (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
                        nasm::r10::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr = (element_type *)0x0;
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                                  (&nasm::r10::res.
                                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,(Register **)&nasm::r10::res,
                                   (allocator<mocker::nasm::Register> *)&local_118,
                                   (char (*) [4])"r10");
                        __cxa_atexit(std::
                                     __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                     ::~__shared_ptr,&nasm::r10::res,&__dso_handle);
                        __cxa_guard_release(&nasm::r10()::res);
                      }
                      nasm::Section::
                      emplaceInst<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Register>const&>
                                (text,&nasm::r10::res);
                      goto LAB_001275cd;
                    }
                    local_78.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)
                             local_e8.
                             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    local_78.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_e8.
                         super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        local_e8.
                        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        *(_Atomic_word *)
                         ((long)local_e8.
                                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 8) =
                             *(_Atomic_word *)
                              ((long)local_e8.
                                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                        UNLOCK();
                      }
                      else {
                        *(_Atomic_word *)
                         ((long)local_e8.
                                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 8) =
                             *(_Atomic_word *)
                              ((long)local_e8.
                                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                      }
                    }
                    p_Var4 = std::__cxx11::
                             list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
                             _M_create_node<char_const(&)[1],std::shared_ptr<mocker::nasm::Inst>>
                                       ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>
                                         *)&text->lines,(char (*) [1])0x1aeb1c,&local_78);
                    std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
                    psVar1 = &(text->lines).
                              super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>
                              ._M_impl._M_node._M_size;
                    *psVar1 = *psVar1 + 1;
                    this._M_pi = local_78.
                                 super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi;
                  }
                  else {
                    local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)
                             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             (local_e8.
                              super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1))->
                             _vptr__Sp_counted_base;
                    local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                          &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           (local_e8.
                            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1))->_M_use_count;
                    if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_118.
                         super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_118.
                              super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_118.
                         super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_118.
                              super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    dycVReg((anon_unknown_1 *)&local_108,&local_118);
                    if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_118.
                                 super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    if ((element_type *)
                        local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr == (element_type *)0x0) {
                      local_68.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr = (element_type *)
                               local_e8.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      local_68.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi =
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_e8.
                           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_e8.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          *(_Atomic_word *)
                           ((long)local_e8.
                                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 8) =
                               *(_Atomic_word *)
                                ((long)local_e8.
                                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                          UNLOCK();
                        }
                        else {
                          *(_Atomic_word *)
                           ((long)local_e8.
                                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 8) =
                               *(_Atomic_word *)
                                ((long)local_e8.
                                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                        }
                      }
                      nasm::Section::appendInst(text,&local_68);
                      this._M_pi = local_68.
                                   super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi;
                    }
                    else {
                      psVar3 = nasm::r10();
                      loadVReg(psVar3,(shared_ptr<mocker::nasm::Register> *)&local_108,offsets,text)
                      ;
                      local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr = (element_type *)
                               CONCAT44(local_118.
                                        super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr._4_4_,
                                        *(_Atomic_word *)
                                         ((long)local_e8.
                                                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + 8));
                      psVar3 = nasm::r10();
                      nasm::Section::
                      emplaceInst<mocker::nasm::UnaryInst,mocker::nasm::UnaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&>
                                (text,(OpType *)&local_118,psVar3);
                      psVar3 = nasm::r10();
                      local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr = &((psVar3->
                                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->super_Addr;
                      local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi =
                           (psVar3->
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount._M_pi;
                      if (local_118.
                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                      {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          (local_118.
                           super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count =
                               (local_118.
                                super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          (local_118.
                           super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count =
                               (local_118.
                                super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                        }
                      }
                      storeVReg((shared_ptr<mocker::nasm::Register> *)&local_108,&local_118,offsets,
                                text);
                      this._M_pi = local_118.
                                   super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi;
                    }
                  }
                }
                else {
                  local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)
                           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           (local_e8.
                            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1))->_vptr__Sp_counted_base;
                  local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                        &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         (local_e8.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1))->_M_use_count;
                  if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_118.
                            super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_118.
                            super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  dycVReg((anon_unknown_1 *)&local_108,&local_118);
                  if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_118.
                               super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if ((element_type *)
                      local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr != (element_type *)0x0) {
                    local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[5]>
                              (&local_118.
                                super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,(Register **)&local_118,
                               (allocator<mocker::nasm::Register> *)&local_f8,(char (*) [5])"r10b");
                    local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)
                             CONCAT44(local_f8.
                                      super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr._4_4_,
                                      *(_Atomic_word *)
                                       ((long)local_e8.
                                              super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 8));
                    nasm::Section::
                    emplaceInst<mocker::nasm::Set,mocker::nasm::Set::OpType,std::shared_ptr<mocker::nasm::Register>&>
                              (text,(OpType *)&local_f8,
                               (shared_ptr<mocker::nasm::Register> *)&local_118);
                    if ((nasm::r10()::res == '\0') &&
                       (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
                      nasm::r10::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           = (element_type *)0x0;
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                      __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                                (&nasm::r10::res.
                                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,(Register **)&nasm::r10::res,
                                 (allocator<mocker::nasm::Register> *)&local_d0,(char (*) [4])"r10")
                      ;
                      __cxa_atexit(std::
                                   __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   ::~__shared_ptr,&nasm::r10::res,&__dso_handle);
                      __cxa_guard_release(&nasm::r10()::res);
                    }
                    local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = &(nasm::r10::res.
                               super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->super_Addr;
                    local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         nasm::r10::res.
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                    if (nasm::r10::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (nasm::r10::res.
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (nasm::r10::res.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (nasm::r10::res.
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (nasm::r10::res.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    storeVReg((shared_ptr<mocker::nasm::Register> *)&local_108,&local_f8,offsets,
                              text);
                    goto LAB_00127497;
                  }
                  local_58.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = (element_type *)
                         local_e8.
                         super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                  local_58.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_e8.
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_e8.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      *(_Atomic_word *)
                       ((long)local_e8.
                              super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 8) =
                           *(_Atomic_word *)
                            ((long)local_e8.
                                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                      UNLOCK();
                    }
                    else {
                      *(_Atomic_word *)
                       ((long)local_e8.
                              super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 8) =
                           *(_Atomic_word *)
                            ((long)local_e8.
                                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                    }
                  }
                  p_Var4 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>
                           ::_M_create_node<char_const(&)[1],std::shared_ptr<mocker::nasm::Inst>>
                                     ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *
                                      )&text->lines,(char (*) [1])0x1aeb1c,&local_58);
                  std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
                  psVar1 = &(text->lines).
                            super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>
                            ._M_impl._M_node._M_size;
                  *psVar1 = *psVar1 + 1;
                  this._M_pi = local_58.
                               super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi;
                }
              }
              else {
                local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = *(element_type **)
                        ((long)local_e8.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 8);
                local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (local_e8.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1))->_vptr__Sp_counted_base;
                if (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_108.
                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_108.
                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                dycVReg((anon_unknown_1 *)&local_118,&local_108);
                if ((element_type *)
                    local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0) {
                  if ((nasm::r10()::res == '\0') &&
                     (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
                    nasm::r10::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                              (&nasm::r10::res.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,(Register **)&nasm::r10::res,
                               (allocator<mocker::nasm::Register> *)&local_f8,(char (*) [4])"r10");
                    __cxa_atexit(std::
                                 __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                                 ~__shared_ptr,&nasm::r10::res,&__dso_handle);
                    __cxa_guard_release(&nasm::r10()::res);
                  }
                  loadVReg(&nasm::r10::res,(shared_ptr<mocker::nasm::Register> *)&local_118,offsets,
                           text);
                  if ((nasm::r10()::res == '\0') &&
                     (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
                    nasm::r10::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                              (&nasm::r10::res.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,(Register **)&nasm::r10::res,
                               (allocator<mocker::nasm::Register> *)&local_f8,(char (*) [4])"r10");
                    __cxa_atexit(std::
                                 __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                                 ~__shared_ptr,&nasm::r10::res,&__dso_handle);
                    __cxa_guard_release(&nasm::r10()::res);
                  }
                  local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = &(nasm::r10::res.
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->super_Addr;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                            (&local_108.
                              super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,
                             &nasm::r10::res.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                }
                if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_118.
                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = *(element_type **)
                        &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         (local_e8.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1))->_M_use_count;
                local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (local_e8.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 2))->_vptr__Sp_counted_base;
                if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_118.
                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_118.
                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                dycVReg((anon_unknown_1 *)&local_f8,&local_118);
                if ((element_type *)
                    local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0) {
                  if ((nasm::r11()::res == '\0') &&
                     (iVar2 = __cxa_guard_acquire(&nasm::r11()::res), iVar2 != 0)) {
                    nasm::r11::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                              (&nasm::r11::res.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,(Register **)&nasm::r11::res,
                               (allocator<mocker::nasm::Register> *)&local_d0,(char (*) [4])"r11");
                    __cxa_atexit(std::
                                 __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                                 ~__shared_ptr,&nasm::r11::res,&__dso_handle);
                    __cxa_guard_release(&nasm::r11()::res);
                  }
                  loadVReg(&nasm::r11::res,(shared_ptr<mocker::nasm::Register> *)&local_f8,offsets,
                           text);
                  if ((nasm::r11()::res == '\0') &&
                     (iVar2 = __cxa_guard_acquire(&nasm::r11()::res), iVar2 != 0)) {
                    nasm::r11::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                              (&nasm::r11::res.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,(Register **)&nasm::r11::res,
                               (allocator<mocker::nasm::Register> *)&local_d0,(char (*) [4])"r11");
                    __cxa_atexit(std::
                                 __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                                 ~__shared_ptr,&nasm::r11::res,&__dso_handle);
                    __cxa_guard_release(&nasm::r11()::res);
                  }
                  local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = &(nasm::r11::res.
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->super_Addr;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                            (&local_118.
                              super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,
                             &nasm::r11::res.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                }
                if (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_f8.
                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                nasm::Section::
                emplaceInst<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
                          (text,&local_108,&local_118);
                this._M_pi = local_118.
                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
              }
            }
            else {
              local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(element_type **)
                    ((long)local_e8.
                           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 8);
              local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (local_e8.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1))->_vptr__Sp_counted_base;
              if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              dycVReg((anon_unknown_1 *)&local_108,&local_118);
              if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_118.
                           super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if ((element_type *)
                  local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr == (element_type *)0x0) goto LAB_001275cd;
              if ((nasm::r10()::res == '\0') &&
                 (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
                nasm::r10::res.
                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                          (&nasm::r10::res.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Register **)&nasm::r10::res,
                           (allocator<mocker::nasm::Register> *)&local_118,(char (*) [4])"r10");
                __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                             ~__shared_ptr,&nasm::r10::res,&__dso_handle);
                __cxa_guard_release(&nasm::r10()::res);
              }
              nasm::Section::
              emplaceInst<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>const&>
                        (text,&nasm::r10::res,
                         (shared_ptr<mocker::nasm::Addr> *)
                         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          (local_e8.
                           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1))->_M_use_count);
              if ((nasm::r10()::res == '\0') &&
                 (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
                nasm::r10::res.
                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                          (&nasm::r10::res.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Register **)&nasm::r10::res,
                           (allocator<mocker::nasm::Register> *)&local_f8,(char (*) [4])"r10");
                __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                             ~__shared_ptr,&nasm::r10::res,&__dso_handle);
                __cxa_guard_release(&nasm::r10()::res);
              }
              local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   &(nasm::r10::res.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_Addr;
              local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   nasm::r10::res.
                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if (nasm::r10::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (nasm::r10::res.
                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (nasm::r10::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (nasm::r10::res.
                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (nasm::r10::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              storeVReg((shared_ptr<mocker::nasm::Register> *)&local_108,&local_118,offsets,text);
              this._M_pi = local_118.
                           super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
            }
          }
          else {
            local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(element_type **)
                  ((long)local_e8.
                         super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 8);
            local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (local_e8.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1))->_vptr__Sp_counted_base;
            if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            dycVReg((anon_unknown_1 *)&local_108,&local_118);
            if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_118.
                         super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((element_type *)
                local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                == (element_type *)0x0) {
              __assert_fail("reg",
                            "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                            ,0xb2,
                            "void mocker::(anonymous namespace)::allocate(const std::shared_ptr<nasm::Inst> &, const RegMap<std::size_t> &, nasm::Section &)"
                           );
            }
            if ((nasm::r10()::res == '\0') &&
               (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
              nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                        (&nasm::r10::res.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(Register **)&nasm::r10::res,
                         (allocator<mocker::nasm::Register> *)&local_118,(char (*) [4])"r10");
              __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                           ~__shared_ptr,&nasm::r10::res,&__dso_handle);
              __cxa_guard_release(&nasm::r10()::res);
            }
            nasm::Section::
            emplaceInst<mocker::nasm::Pop,std::shared_ptr<mocker::nasm::Register>const&>
                      (text,&nasm::r10::res);
            if ((nasm::r10()::res == '\0') &&
               (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
              nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                        (&nasm::r10::res.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(Register **)&nasm::r10::res,
                         (allocator<mocker::nasm::Register> *)&local_f8,(char (*) [4])"r10");
              __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                           ~__shared_ptr,&nasm::r10::res,&__dso_handle);
              __cxa_guard_release(&nasm::r10()::res);
            }
            local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 &(nasm::r10::res.
                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_Addr;
            local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = nasm::r10::res.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            if (nasm::r10::res.
                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (nasm::r10::res.
                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_use_count =
                     (nasm::r10::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (nasm::r10::res.
                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_use_count =
                     (nasm::r10::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            storeVReg((shared_ptr<mocker::nasm::Register> *)&local_108,&local_118,offsets,text);
            this._M_pi = local_118.
                         super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          }
          goto LAB_001274ab;
        }
        local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)
              ((long)local_e8.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 8);
        local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (local_e8.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1))->_vptr__Sp_counted_base;
        if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        dycVReg((anon_unknown_1 *)&local_108,&local_118);
        if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)
            local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          __assert_fail("reg",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                        ,0xab,
                        "void mocker::(anonymous namespace)::allocate(const std::shared_ptr<nasm::Inst> &, const RegMap<std::size_t> &, nasm::Section &)"
                       );
        }
        if ((nasm::r10()::res == '\0') &&
           (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
          nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&nasm::r10::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&nasm::r10::res,
                     (allocator<mocker::nasm::Register> *)&local_118,(char (*) [4])"r10");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&nasm::r10::res,&__dso_handle);
          __cxa_guard_release(&nasm::r10()::res);
        }
        loadVReg(&nasm::r10::res,(shared_ptr<mocker::nasm::Register> *)&local_108,offsets,text);
        if ((nasm::r10()::res == '\0') &&
           (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
          nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&nasm::r10::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&nasm::r10::res,
                     (allocator<mocker::nasm::Register> *)&local_118,(char (*) [4])"r10");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&nasm::r10::res,&__dso_handle);
          __cxa_guard_release(&nasm::r10()::res);
        }
        nasm::Section::emplaceInst<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Register>const&>
                  (text,&nasm::r10::res);
      }
      else {
        local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (local_e8.
              super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 2))->_vptr__Sp_counted_base;
        local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (local_e8.
                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2))->_M_use_count;
        if (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        dycVReg((anon_unknown_1 *)&local_118,&local_108);
        if ((element_type *)
            local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if ((nasm::r10()::res == '\0') &&
             (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
            nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::r10::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::r10::res,
                       (allocator<mocker::nasm::Register> *)&local_f8,(char (*) [4])"r10");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::r10::res,&__dso_handle);
            __cxa_guard_release(&nasm::r10()::res);
          }
          loadVReg(&nasm::r10::res,(shared_ptr<mocker::nasm::Register> *)&local_118,offsets,text);
          if ((nasm::r10()::res == '\0') &&
             (iVar2 = __cxa_guard_acquire(&nasm::r10()::res), iVar2 != 0)) {
            nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::r10::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::r10::res,
                       (allocator<mocker::nasm::Register> *)&local_f8,(char (*) [4])"r10");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::r10::res,&__dso_handle);
            __cxa_guard_release(&nasm::r10()::res);
          }
          local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &(nasm::r10::res.
                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Addr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &nasm::r10::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (local_e8.
              super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1))->_vptr__Sp_counted_base;
        local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (local_e8.
                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1))->_M_use_count;
        if (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        dycVReg((anon_unknown_1 *)&local_f8,&local_118);
        if ((element_type *)
            local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if ((nasm::r11()::res == '\0') &&
             (iVar2 = __cxa_guard_acquire(&nasm::r11()::res), iVar2 != 0)) {
            nasm::r11::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::r11::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::r11::res,
                       (allocator<mocker::nasm::Register> *)&local_d0,(char (*) [4])"r11");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::r11::res,&__dso_handle);
            __cxa_guard_release(&nasm::r11()::res);
          }
          loadVReg(&nasm::r11::res,(shared_ptr<mocker::nasm::Register> *)&local_f8,offsets,text);
          if ((nasm::r11()::res == '\0') &&
             (iVar2 = __cxa_guard_acquire(&nasm::r11()::res), iVar2 != 0)) {
            nasm::r11::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::r11::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::r11::res,
                       (allocator<mocker::nasm::Register> *)&local_d0,(char (*) [4])"r11");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::r11::res,&__dso_handle);
            __cxa_guard_release(&nasm::r11()::res);
          }
          local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &(nasm::r11::res.
                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Addr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &nasm::r11::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        if (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             CONCAT44(local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._4_4_,
                      *(_Atomic_word *)
                       ((long)local_e8.
                              super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 8));
        nasm::Section::
        emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
                  (text,(OpType *)&local_f8,&local_118,&local_108);
        dycVReg((anon_unknown_1 *)&local_f8,
                (shared_ptr<mocker::nasm::Addr> *)
                (local_e8.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1));
        if ((element_type *)
            local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          storeVReg((shared_ptr<mocker::nasm::Register> *)&local_f8,&local_118,offsets,text);
        }
LAB_00127497:
        this._M_pi = local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
        if (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          this._M_pi = local_118.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
        }
LAB_001274ab:
        if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
        }
      }
LAB_001275cd:
      local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_e8.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_108.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_e8.
                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      goto LAB_00127a98;
    }
  }
  local_38.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (inst->super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (inst->super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_38.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_38.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  p_Var4 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
           _M_create_node<char_const(&)[1],std::shared_ptr<mocker::nasm::Inst>>
                     ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&text->lines,
                      (char (*) [1])0x1aeb1c,&local_38);
  std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
  psVar1 = &(text->lines).super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  local_40 = local_38.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
LAB_00127a98:
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  return;
}

Assistant:

void allocate(const std::shared_ptr<nasm::Inst> &inst,
              const RegMap<std::size_t> &offsets, nasm::Section &text) {
  if (nasm::getInvolvedRegs(inst).empty() || nasm::dyc<nasm::Call>(inst) ||
      nasm::dyc<nasm::Leave>(inst) || nasm::dyc<nasm::Ret>(inst) ||
      nasm::dyc<nasm::Cqo>(inst)) {
    text.appendInst(inst);
    return;
  }
  auto load = [&offsets, &text](const std::shared_ptr<nasm::Register> &dest,
                                const std::shared_ptr<nasm::Register> &src) {
    loadVReg(dest, src, offsets, text);
  };
  auto store = [&offsets, &text](const std::shared_ptr<nasm::Register> &dest,
                                 const std::shared_ptr<nasm::Addr> &val) {
    storeVReg(dest, val, offsets, text);
  };

  if (auto p = nasm::dyc<nasm::Mov>(inst)) {
    allocateMov(p, offsets, text);
    return;
  }
  if (auto p = nasm::dyc<nasm::BinaryInst>(inst)) {
    auto rhs = p->getRhs();
    if (auto reg = dycVReg(rhs)) {
      load(nasm::r10(), reg);
      rhs = nasm::r10();
    }
    auto lhs = p->getLhs();
    if (auto reg = dycVReg(lhs)) {
      load(nasm::r11(), reg);
      lhs = nasm::r11();
    }
    text.emplaceInst<nasm::BinaryInst>(p->getType(), lhs, rhs);
    if (auto reg = dycVReg(p->getLhs()))
      store(reg, lhs);
    return;
  }
  if (auto p = nasm::dyc<nasm::Push>(inst)) {
    auto reg = dycVReg(p->getReg());
    assert(reg);
    load(nasm::r10(), reg);
    text.emplaceInst<nasm::Push>(nasm::r10());
    return;
  }
  if (auto p = nasm::dyc<nasm::Pop>(inst)) {
    auto reg = dycVReg(p->getReg());
    assert(reg);
    text.emplaceInst<nasm::Pop>(nasm::r10());
    store(reg, nasm::r10());
    return;
  }
  if (auto p = nasm::dyc<nasm::Lea>(inst)) {
    auto reg = dycVReg(p->getDest());
    if (!reg)
      return;
    text.emplaceInst<nasm::Lea>(nasm::r10(), p->getAddr());
    store(reg, nasm::r10());
    return;
  }
  if (auto p = nasm::dyc<nasm::Cmp>(inst)) {
    auto lhs = p->getLhs();
    if (auto reg = dycVReg(lhs)) {
      loadVReg(nasm::r10(), reg, offsets, text);
      lhs = nasm::r10();
    }
    auto rhs = p->getRhs();
    if (auto reg = dycVReg(rhs)) {
      loadVReg(nasm::r11(), reg, offsets, text);
      rhs = nasm::r11();
    }
    text.emplaceInst<nasm::Cmp>(lhs, rhs);
    return;
  }
  if (auto p = nasm::dyc<nasm::Set>(inst)) {
    auto reg = dycVReg(p->getReg());
    if (!reg) {
      text.appendInst(p);
      return;
    }
    auto tmp = std::make_shared<nasm::Register>("r10b");
    text.emplaceInst<nasm::Set>(p->getOp(), tmp);
    storeVReg(reg, nasm::r10(), offsets, text);
    return;
  }
  if (auto p = nasm::dyc<nasm::UnaryInst>(inst)) {
    auto reg = dycVReg(p->getReg());
    if (!reg) {
      text.appendInst(p);
      return;
    }
    load(nasm::r10(), reg);
    text.emplaceInst<nasm::UnaryInst>(p->getOp(), nasm::r10());
    store(reg, nasm::r10());
    return;
  }
  if (auto p = nasm::dyc<nasm::IDiv>(inst)) {
    auto reg = dycVReg(p->getRhs());
    if (!reg) {
      text.appendInst(p);
      return;
    }
    load(nasm::r10(), reg);
    text.emplaceInst<nasm::IDiv>(nasm::r10());
    return;
  }

  assert(false);
}